

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O0

bool __thiscall Pig::getDigit2(Pig *this,int *result)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  intmax_t iVar4;
  string local_40 [32];
  int *local_20;
  int *result_local;
  Pig *this_local;
  
  local_20 = result;
  result_local = (int *)this;
  peVar2 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
  bVar1 = unicodeLatinDigit((int)*pcVar3);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)peVar2);
    bVar1 = unicodeLatinDigit((int)*pcVar3);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)local_40,(ulong)peVar2);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar4 = strtoimax(pcVar3,(char **)0x0,10);
      *local_20 = (int)iVar4;
      std::__cxx11::string::~string(local_40);
      this->_cursor = this->_cursor + 2;
      return true;
    }
  }
  return false;
}

Assistant:

bool Pig::getDigit2 (int& result)
{
  if (unicodeLatinDigit ((*_text)[_cursor + 0]))
  {
    if (unicodeLatinDigit ((*_text)[_cursor + 1]))
    {
      result = strtoimax (_text->substr (_cursor, 2).c_str (), NULL, 10);
      _cursor += 2;
      return true;
    }
  }

  return false;
}